

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O3

void __thiscall Ptex::v2_4::PtexReaderCache::pruneFiles(PtexReaderCache *this)

{
  bool bVar1;
  PtexCachedReader *this_00;
  long lVar2;
  
  lVar2 = this->_filesOpen - this->_maxFiles;
  if (lVar2 != 0) {
    do {
      this_00 = PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_openFilesItem>
                ::pop(&this->_openFiles);
      if (this_00 == (PtexCachedReader *)0x0) {
        this->_filesOpen = 0;
        return;
      }
      bVar1 = PtexReader::tryClose(&this_00->super_PtexReader);
      if (bVar1) {
        lVar2 = lVar2 + -1;
        this->_filesOpen = this->_filesOpen - 1;
      }
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void PtexReaderCache::pruneFiles()
{
    size_t numToClose = _filesOpen - _maxFiles;
    if (numToClose > 0) {
        while (numToClose) {
            PtexCachedReader* reader = _openFiles.pop();
            if (!reader) { _filesOpen = 0; break; }
            if (reader->tryClose()) {
                --numToClose;
                --_filesOpen;
            }
        }
    }
}